

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall CNode::CopyStats(CNode *this,CNodeStats *stats)

{
  Span<const_unsigned_char> s;
  bool bVar1;
  Network NVar2;
  __int_type _Var3;
  NodeId NVar4;
  duration<long,_std::ratio<1L,_1L>_> dVar5;
  duration<long,_std::ratio<1L,_1L>_> dVar6;
  pointer pTVar7;
  duration<long,_std::ratio<1L,_1000000L>_> __str;
  duration<long,_std::ratio<1L,_1000000L>_> this_00;
  CService *in_RSI;
  allocator<char> *in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock35;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock34;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock33;
  CService addrLocalUnlocked;
  Info info;
  CNode *in_stack_fffffffffffffea8;
  CAddress *in_stack_fffffffffffffeb0;
  CNode *in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  undefined4 in_stack_fffffffffffffed0;
  uint uVar8;
  undefined4 in_stack_fffffffffffffed4;
  char *in_stack_fffffffffffffed8;
  allocator<char> *__a;
  CNode *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  size_t in_stack_ffffffffffffff38;
  char local_2a [34];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __a = in_RDI;
  NVar4 = GetId(in_stack_fffffffffffffea8);
  (((mutex *)&in_RSI->super_CNetAddr)->super___mutex_base)._M_mutex.__align = NVar4;
  CAddress::operator=((CAddress *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  CAddress::operator=((CAddress *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  NVar2 = ConnectedThroughNetwork(in_stack_fffffffffffffeb8);
  (((mutex *)&in_RSI[10].super_CNetAddr)->super___mutex_base)._M_mutex.__data.__owner = NVar2;
  dVar5 = std::atomic::operator_cast_to_duration
                    ((atomic<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                     in_stack_fffffffffffffeb0);
  *(rep *)((long)&(((mutex *)&in_RSI->super_CNetAddr)->super___mutex_base)._M_mutex + 8) = dVar5.__r
  ;
  dVar6 = std::atomic::operator_cast_to_duration
                    ((atomic<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                     in_stack_fffffffffffffeb0);
  *(rep *)((long)&(((mutex *)&in_RSI->super_CNetAddr)->super___mutex_base)._M_mutex + 0x10) =
       dVar6.__r;
  dVar6 = std::atomic::operator_cast_to_duration
                    ((atomic<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                     in_stack_fffffffffffffeb0);
  (((mutex *)&in_RSI->super_CNetAddr)->super___mutex_base)._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)dVar6.__r;
  dVar6 = std::atomic::operator_cast_to_duration
                    ((atomic<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                     in_stack_fffffffffffffeb0);
  *(rep *)&in_RSI->port = dVar6.__r;
  (((mutex *)&in_RSI[1].super_CNetAddr)->super___mutex_base)._M_mutex.__align =
       *(long *)(in_RDI + 0x110);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffeb8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffeb0);
  _Var3 = std::__atomic_base::operator_cast_to_int
                    ((__atomic_base<int> *)
                     CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
  (((mutex *)&in_RSI[2].super_CNetAddr)->super___mutex_base)._M_mutex.__data.__lock = _Var3;
  MaybeCheckNotHeld((Mutex *)in_stack_fffffffffffffea8);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)__a,(AnnotatedMixin<std::mutex> *)in_RSI,
             in_stack_fffffffffffffed8,
             (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             (int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffeb8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffeb0);
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_fffffffffffffea8);
  bVar1 = IsInboundConn(in_stack_fffffffffffffea8);
  (((mutex *)&in_RSI[3].super_CNetAddr)->super___mutex_base)._M_mutex.__size[0] = bVar1;
  bVar1 = std::atomic::operator_cast_to_bool
                    ((atomic<bool> *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
  (((mutex *)&in_RSI[3].super_CNetAddr)->super___mutex_base)._M_mutex.__size[1] = bVar1;
  bVar1 = std::atomic::operator_cast_to_bool
                    ((atomic<bool> *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
  (((mutex *)&in_RSI[3].super_CNetAddr)->super___mutex_base)._M_mutex.__size[2] = bVar1;
  MaybeCheckNotHeld((Mutex *)in_stack_fffffffffffffea8);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)__a,(AnnotatedMixin<std::mutex> *)in_RSI,
             in_stack_fffffffffffffed8,
             (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             (int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::operator=((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               *)in_stack_fffffffffffffeb8,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               *)in_stack_fffffffffffffeb0);
  *(undefined8 *)((long)&(((mutex *)&in_RSI[3].super_CNetAddr)->super___mutex_base)._M_mutex + 8) =
       *(undefined8 *)(in_RDI + 0x28);
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_fffffffffffffea8);
  MaybeCheckNotHeld((Mutex *)in_stack_fffffffffffffea8);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)__a,(AnnotatedMixin<std::mutex> *)in_RSI,
             in_stack_fffffffffffffed8,
             (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             (int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::operator=((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               *)in_stack_fffffffffffffeb8,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               *)in_stack_fffffffffffffeb0);
  (((mutex *)&in_RSI[4].super_CNetAddr)->super___mutex_base)._M_mutex.__data.__list.__prev =
       *(__pthread_internal_list **)(in_RDI + 0xf8);
  pTVar7 = std::unique_ptr<Transport,_std::default_delete<Transport>_>::operator->
                     (&in_stack_fffffffffffffea8->m_transport);
  (*pTVar7->_vptr_Transport[2])(local_2a);
  (((mutex *)&in_RSI[10].super_CNetAddr)->super___mutex_base)._M_mutex.__size[0x14] = local_2a[0];
  bVar1 = std::optional::operator_cast_to_bool((optional<uint256> *)in_stack_fffffffffffffea8);
  if (bVar1) {
    std::optional<uint256>::operator*((optional<uint256> *)in_stack_fffffffffffffea8);
    Span<const_unsigned_char>::Span<uint256>
              ((Span<const_unsigned_char> *)in_stack_fffffffffffffeb8,
               (uint256 *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    s.m_size = in_stack_ffffffffffffff38;
    s.m_data = (uchar *)dVar5.__r;
    HexStr_abi_cxx11_(s);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffea8);
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_fffffffffffffea8);
  (((mutex *)&in_RSI[6].super_CNetAddr)->super___mutex_base)._M_mutex.__data.__lock =
       *(int *)(in_RDI + 8);
  __str = std::atomic::operator_cast_to_duration
                    ((atomic<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_> *)
                     in_stack_fffffffffffffeb0);
  *(rep *)((long)&(((mutex *)&in_RSI[6].super_CNetAddr)->super___mutex_base)._M_mutex + 8) =
       __str.__r;
  this_00 = std::atomic::operator_cast_to_duration
                      ((atomic<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_> *)
                       in_stack_fffffffffffffeb0);
  *(rep *)((long)&(((mutex *)&in_RSI[6].super_CNetAddr)->super___mutex_base)._M_mutex + 0x10) =
       this_00.__r;
  GetAddrLocal(in_stack_fffffffffffffef0);
  uVar8 = 0;
  bVar1 = CNetAddr::IsValid((CNetAddr *)
                            CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
  if (bVar1) {
    CService::ToStringAddrPort_abi_cxx11_(in_RSI);
  }
  else {
    std::allocator<char>::allocator();
    uVar8 = 0x1000000;
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00.__r,
               (char *)in_stack_fffffffffffffef0,__a);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (in_stack_ffffffffffffff08,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str.__r);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffea8);
  if ((uVar8 & 0x1000000) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffef7);
  }
  in_RSI[10].super_CNetAddr.m_addr._size = *(size_type *)(in_RDI + 0x244);
  CService::~CService((CService *)in_stack_fffffffffffffea8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CNode::CopyStats(CNodeStats& stats)
{
    stats.nodeid = this->GetId();
    X(addr);
    X(addrBind);
    stats.m_network = ConnectedThroughNetwork();
    X(m_last_send);
    X(m_last_recv);
    X(m_last_tx_time);
    X(m_last_block_time);
    X(m_connected);
    X(m_addr_name);
    X(nVersion);
    {
        LOCK(m_subver_mutex);
        X(cleanSubVer);
    }
    stats.fInbound = IsInboundConn();
    X(m_bip152_highbandwidth_to);
    X(m_bip152_highbandwidth_from);
    {
        LOCK(cs_vSend);
        X(mapSendBytesPerMsgType);
        X(nSendBytes);
    }
    {
        LOCK(cs_vRecv);
        X(mapRecvBytesPerMsgType);
        X(nRecvBytes);
        Transport::Info info = m_transport->GetInfo();
        stats.m_transport_type = info.transport_type;
        if (info.session_id) stats.m_session_id = HexStr(*info.session_id);
    }
    X(m_permission_flags);

    X(m_last_ping_time);
    X(m_min_ping_time);

    // Leave string empty if addrLocal invalid (not filled in yet)
    CService addrLocalUnlocked = GetAddrLocal();
    stats.addrLocal = addrLocalUnlocked.IsValid() ? addrLocalUnlocked.ToStringAddrPort() : "";

    X(m_conn_type);
}